

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_map_get(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSMapState *s;
  int *piVar1;
  JSValueUnion JVar2;
  JSMapRecord *pJVar3;
  ulong uVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  ulong uVar7;
  JSValue JVar8;
  JSValue key;
  
  if ((((int)this_val.tag == -1) && (magic + 0x1fU == (uint)*(ushort *)((long)this_val.u.ptr + 6)))
     && (s = *(JSMapState **)((long)this_val.u.ptr + 0x30), s != (JSMapState *)0x0)) {
    JVar5 = (JSValueUnion)argv->tag;
    JVar2.ptr = (argv->u).ptr;
    if (((ulong)(argv->u).ptr & 0x7fffffffffffffff) == 0 && (argv->tag & 0xffffffffU) == 7) {
      JVar5.float64 = 0.0;
      JVar2.float64 = 0.0;
    }
    key.tag = (int64_t)JVar5.ptr;
    key.u.ptr = JVar2.ptr;
    pJVar3 = map_find_record(ctx,s,key);
    if (pJVar3 != (JSMapRecord *)0x0) {
      piVar1 = (int *)(pJVar3->value).u.ptr;
      iVar6 = (pJVar3->value).tag;
      if (0xfffffff4 < (uint)iVar6) {
        *piVar1 = *piVar1 + 1;
      }
      uVar4 = (ulong)piVar1 & 0xffffffff00000000;
      uVar7 = (ulong)piVar1 & 0xffffffff;
      goto LAB_001451ea;
    }
    iVar6 = 3;
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,magic + 0x1fU);
    iVar6 = 6;
  }
  uVar7 = 0;
  uVar4 = 0;
LAB_001451ea:
  JVar8.tag = iVar6;
  JVar8.u.ptr = (void *)(uVar7 | uVar4);
  return JVar8;
}

Assistant:

static JSValue js_map_get(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    mr = map_find_record(ctx, s, key);
    if (!mr)
        return JS_UNDEFINED;
    else
        return JS_DupValue(ctx, mr->value);
}